

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,
               GeneratorContext *context)

{
  MessageDefPtr message;
  EnumDefPtr e;
  FieldDefPtr ext;
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *psVar4;
  FileDefPtr file_00;
  FileDefPtr file_01;
  FileDefPtr file_02;
  int *in_R9;
  pointer pMVar5;
  string_view src;
  string_view src_00;
  string_view src_01;
  string_view full_name;
  string_view full_name_00;
  string_view full_name_01;
  int i;
  pointer local_e8;
  Output output;
  LogMessageFatal local_a8;
  string local_98;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  long *plVar3;
  
  psVar4 = (string *)context;
  SortedMessages(&messages,file);
  SortedExtensions(&extensions,file);
  SortedEnums(&enums,file,kClosedEnums);
  i = 0;
  local_e8 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar5 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar5 != local_e8; pMVar5 = pMVar5 + 1)
  {
    message.ptr_ = pMVar5->ptr_;
    output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
    output.output_._M_string_length = 0;
    output.output_.field_2._M_local_buf[0] = '\0';
    WriteMiniTableSourceIncludes(file,options,&output);
    psVar4 = (string *)&output;
    anon_unknown_7::WriteMessage(message,pools,options,&output);
    upb_MessageDef_FullName(message.ptr_);
    full_name._M_str = (char *)&i;
    full_name._M_len = (size_t)psVar4;
    MultipleSourceFilename_abi_cxx11_(&local_98,(generator *)file.ptr_,file_00,full_name,in_R9);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_98);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::~string((string *)&local_98);
    src._M_str = output.output_._M_dataplus._M_p;
    src._M_len = output.output_._M_string_length;
    absl::lts_20250127::Cord::Cord((Cord *)&local_98,src);
    cVar1 = (**(code **)(*plVar3 + 0x38))(plVar3,&local_98);
    if (cVar1 == '\0') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                 ,0x1c6,"stream->WriteCord(absl::Cord(output.output()))");
      goto LAB_001b9998;
    }
    absl::lts_20250127::Cord::~Cord((Cord *)&local_98);
    (**(code **)(*plVar3 + 8))(plVar3);
    std::__cxx11::string::~string((string *)&output);
  }
  local_e8 = (pointer)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  pMVar5 = (pointer)enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  do {
    if (pMVar5 == local_e8) {
      local_e8 = (pointer)extensions.
                          super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
      pMVar5 = (pointer)extensions.
                        super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pMVar5 == local_e8) {
          std::_Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~_Vector_base
                    (&enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>);
          std::_Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~_Vector_base
                    (&extensions.
                      super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>);
          std::_Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~_Vector_base
                    (&messages.
                      super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>);
          return;
        }
        ext.ptr_ = (upb_FieldDef *)pMVar5->ptr_;
        output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
        output.output_._M_string_length = 0;
        output.output_.field_2._M_local_buf[0] = '\0';
        WriteMiniTableSourceIncludes(file,options,&output);
        anon_unknown_7::WriteExtension(pools,ext,&output);
        upb_FieldDef_FullName(ext.ptr_);
        full_name_01._M_str = (char *)&i;
        full_name_01._M_len = (size_t)psVar4;
        MultipleSourceFilename_abi_cxx11_
                  (&local_98,(generator *)file.ptr_,file_02,full_name_01,in_R9);
        iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_98);
        plVar3 = (long *)CONCAT44(extraout_var_01,iVar2);
        std::__cxx11::string::~string((string *)&local_98);
        src_01._M_str = output.output_._M_dataplus._M_p;
        src_01._M_len = output.output_._M_string_length;
        absl::lts_20250127::Cord::Cord((Cord *)&local_98,src_01);
        cVar1 = (**(code **)(*plVar3 + 0x38))(plVar3,&local_98);
        if (cVar1 == '\0') break;
        absl::lts_20250127::Cord::~Cord((Cord *)&local_98);
        (**(code **)(*plVar3 + 8))(plVar3);
        std::__cxx11::string::~string((string *)&output);
        pMVar5 = pMVar5 + 1;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                 ,0x1d6,"stream->WriteCord(absl::Cord(output.output()))");
LAB_001b9998:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_a8);
    }
    e.ptr_ = (upb_EnumDef *)pMVar5->ptr_;
    output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
    output.output_._M_string_length = 0;
    output.output_.field_2._M_local_buf[0] = '\0';
    WriteMiniTableSourceIncludes(file,options,&output);
    anon_unknown_7::WriteEnum(e,&output);
    upb_EnumDef_FullName(e.ptr_);
    full_name_00._M_str = (char *)&i;
    full_name_00._M_len = (size_t)psVar4;
    MultipleSourceFilename_abi_cxx11_(&local_98,(generator *)file.ptr_,file_01,full_name_00,in_R9);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context,&local_98);
    plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
    std::__cxx11::string::~string((string *)&local_98);
    src_00._M_str = output.output_._M_dataplus._M_p;
    src_00._M_len = output.output_._M_string_length;
    absl::lts_20250127::Cord::Cord((Cord *)&local_98,src_00);
    cVar1 = (**(code **)(*plVar3 + 0x38))(plVar3,&local_98);
    if (cVar1 == '\0') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb_generator/minitable/generator.cc"
                 ,0x1ce,"stream->WriteCord(absl::Cord(output.output()))");
      goto LAB_001b9998;
    }
    absl::lts_20250127::Cord::~Cord((Cord *)&local_98);
    (**(code **)(*plVar3 + 8))(plVar3);
    std::__cxx11::string::~string((string *)&output);
    pMVar5 = pMVar5 + 1;
  } while( true );
}

Assistant:

void WriteMiniTableMultipleSources(
    const DefPoolPair& pools, upb::FileDefPtr file,
    const MiniTableOptions& options,
    google::protobuf::compiler::GeneratorContext* context) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, message.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, e.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    auto stream = absl::WrapUnique(
        context->Open(MultipleSourceFilename(file, ext.full_name(), &i)));
    ABSL_CHECK(stream->WriteCord(absl::Cord(output.output())));
  }
}